

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QRhiVertexInputLayout *v)

{
  QDebug debug;
  long lVar1;
  qsizetype qVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)v);
  *(undefined1 *)
   ((v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)v,"QRhiVertexInputLayout(bindings=");
  local_60._0_8_ = pQVar3->stream;
  ((Stream *)local_60._0_8_)->ref = ((Stream *)local_60._0_8_)->ref + 1;
  debug.stream = (Stream *)(local_60 + 8);
  operator<<(debug,(QVarLengthArray<QRhiVertexInputBinding,_8LL> *)local_60);
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream," attributes=");
  local_60._16_8_ = pQVar3->stream;
  ((Stream *)local_60._16_8_)->ref = ((Stream *)local_60._16_8_)->ref + 1;
  operator<<((Stream *)local_48,(QVarLengthArray<QRhiVertexInputAttribute,_8LL> *)(local_60 + 0x10))
  ;
  QDebug::operator<<((QDebug *)local_48,')');
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug((QDebug *)(local_60 + 0x10));
  QDebug::~QDebug((QDebug *)debug.stream);
  QDebug::~QDebug((QDebug *)local_60);
  qVar2 = (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a;
  (v->m_bindings).super_QVLABase<QRhiVertexInputBinding>.super_QVLABaseBase.a = 0;
  *(qsizetype *)dbg.stream = qVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiVertexInputLayout &v)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiVertexInputLayout(bindings=" << v.m_bindings
                  << " attributes=" << v.m_attributes
                  << ')';
    return dbg;
}